

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O0

void __thiscall ProblemAloha::ConstructActions(ProblemAloha *this)

{
  long in_RDI;
  Index agentIndex;
  string *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  allocator<char> *in_stack_ffffffffffffff18;
  Index AI;
  MultiAgentDecisionProcessDiscreteFactoredStates *this_00;
  allocator<char> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  allocator<char> local_91;
  string local_90 [39];
  undefined1 local_69 [56];
  allocator<char> local_31;
  string local_30 [36];
  uint local_c;
  
  for (local_c = 0; AI = (Index)((ulong)in_stack_ffffffffffffff18 >> 0x20),
      (ulong)local_c < *(ulong *)(in_RDI + 0x50); local_c = local_c + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    this_00 = (MultiAgentDecisionProcessDiscreteFactoredStates *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    MultiAgentDecisionProcessDiscreteFactoredStates::AddAction
              (this_00,AI,(string *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    std::__cxx11::string::~string((string *)(local_69 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
    in_stack_ffffffffffffff18 = &local_91;
    in_stack_ffffffffffffff14 = local_c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff08 = (string *)&stack0xffffffffffffff47;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    MultiAgentDecisionProcessDiscreteFactoredStates::AddAction
              (this_00,(Index)((ulong)in_stack_ffffffffffffff18 >> 0x20),
               (string *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  return;
}

Assistant:

void ProblemAloha::ConstructActions()
{
    for(Index agentIndex=0; agentIndex < _m_nrAgents; agentIndex++)
    {
//         _m_nrActions.push_back(2);
//         _m_actionVecs.push_back(vector<ActionDiscrete>() );
        if(SEND==0) // make sure we add them in the correct order
        {
            AddAction(agentIndex,"send","Attempt to send a packet");
            AddAction(agentIndex,"idle","Do nothing, remain idle");
        }
        else
        {
            AddAction(agentIndex,"send","Attempt to send a packet");
            AddAction(agentIndex,"idle","Do nothing, remain idle");
        }

    }
}